

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O1

void __thiscall VGMPlayer::Cmd_EndOfData(VGMPlayer *this)

{
  uint uVar1;
  PLAYER_EVENT_CB p_Var2;
  UINT8 UVar3;
  pointer pCVar4;
  long lVar5;
  ulong uVar6;
  
  if ((this->_fileHdr).loopOfs == 0) {
    this->_playState = this->_playState | 2;
    this->_psTrigger = this->_psTrigger | 2;
    p_Var2 = (this->super_PlayerBase)._eventCbFunc;
    if (p_Var2 != (PLAYER_EVENT_CB)0x0) {
      (*p_Var2)(&this->super_PlayerBase,(this->super_PlayerBase)._eventCbParam,'\x04',(void *)0x0);
    }
    UVar3 = (this->_playOpts).hardStopOld;
    if (((UVar3 != '\0') &&
        (uVar1 = (this->_fileHdr).fileVer, UVar3 == '\x02' && uVar1 == 0x150 || uVar1 < 0x150)) &&
       (pCVar4 = (this->_devices).
                 super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (this->_devices).
       super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>._M_impl.
       super__Vector_impl_data._M_finish != pCVar4)) {
      lVar5 = 0x10;
      uVar6 = 0;
      do {
        (**(code **)(*(long *)((long)(pCVar4->base).resmpl.smplBufs + lVar5 + -0x68) + 0x28))
                  (*(undefined8 *)((long)(pCVar4->base).resmpl.smplBufs + lVar5 + -0x78));
        uVar6 = uVar6 + 1;
        pCVar4 = (this->_devices).
                 super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 0xd0;
      } while (uVar6 < (ulong)(((long)(this->_devices).
                                      super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4 >> 4
                               ) * 0x4ec4ec4ec4ec4ec5));
    }
  }
  else {
    this->_curLoop = this->_curLoop + 1;
    p_Var2 = (this->super_PlayerBase)._eventCbFunc;
    if ((p_Var2 != (PLAYER_EVENT_CB)0x0) &&
       (UVar3 = (*p_Var2)(&this->super_PlayerBase,(this->super_PlayerBase)._eventCbParam,'\x03',
                          &this->_curLoop), UVar3 == '\x01')) {
      this->_playState = this->_playState | 2;
      this->_psTrigger = this->_psTrigger | 2;
      return;
    }
    this->_filePos = (this->_fileHdr).loopOfs;
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_EndOfData(void)
{
	if (! _fileHdr.loopOfs)
	{
		_playState |= PLAYSTATE_END;
		_psTrigger |= PLAYSTATE_END;
		if (_eventCbFunc != NULL)
			_eventCbFunc(this, _eventCbParam, PLREVT_END, NULL);
		
		if (_playOpts.hardStopOld)
		{
			UINT8 doStop = 0x00;
			doStop |= (_fileHdr.fileVer < 0x150) << 0;
			doStop |= (_fileHdr.fileVer == 0x150 && _playOpts.hardStopOld == 2) << 1;
			if (doStop)
			{
				size_t curDev;
				for (curDev = 0; curDev < _devices.size(); curDev ++)
				{
					DEV_INFO* devInf = &_devices[curDev].base.defInf;
					devInf->devDef->Reset(devInf->dataPtr);
				}
			}
		}
	}
	else
	{
		_curLoop ++;
		if (_eventCbFunc != NULL)
		{
			UINT8 retVal;
			
			retVal = _eventCbFunc(this, _eventCbParam, PLREVT_LOOP, &_curLoop);
			if (retVal == 0x01)
			{
				_playState |= PLAYSTATE_END;
				_psTrigger |= PLAYSTATE_END;
				return;
			}
		}
		_filePos = _fileHdr.loopOfs;
	}
	
	return;
}